

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASTVisitor.h
# Opt level: O0

void __thiscall
slang::ast::ASTVisitor<netlist::InstanceVisitor,_true,_false,_false,_false>::
visit<slang::ast::PrimitivePortSymbol>
          (ASTVisitor<netlist::InstanceVisitor,_true,_false,_false,_false> *this,
          PrimitivePortSymbol *t)

{
  PrimitivePortSymbol *in_RSI;
  ASTVisitor<netlist::InstanceVisitor,_true,_false,_false,_false> *in_RDI;
  
  visitDefault<slang::ast::PrimitivePortSymbol>(in_RDI,in_RSI);
  return;
}

Assistant:

void visit(const T& t) {
        if constexpr (!VisitBad && requires { t.bad(); }) {
            if (t.bad())
                return;
        }

        if constexpr (requires { (DERIVED).handle(t); })
            (DERIVED).handle(t);
        else if constexpr (requires { (DERIVED)(DERIVED, t); })
            (DERIVED)(DERIVED, t);
        else
            visitDefault(t);
    }